

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

void __thiscall OpenMD::StuntDouble::setPrevA(StuntDouble *this,RotMat3x3d *a)

{
  Snapshot *pSVar1;
  SquareMatrix3<double> *in_RDI;
  SquareMatrix3<double> *in_stack_ffffffffffffffd8;
  
  pSVar1 = SnapshotManager::getPrevSnapshot
                     ((SnapshotManager *)
                      (in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [1][0]);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)((long)&(pSVar1->atomData).aMat.
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                (long)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0][2]),
             (long)*(int *)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                           data_[2]);
  SquareMatrix3<double>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

virtual void setPrevA(const RotMat3x3d& a) {
      ((snapshotMan_->getPrevSnapshot())->*storage_).aMat[localIndex_] = a;
    }